

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_openssl.c
# Opt level: O1

int x509_openssl_add_pem_file_key(SSL_CTX *ssl_ctx,char *x509privatekey)

{
  int iVar1;
  BIO *bp;
  EVP_PKEY *pkey;
  rsa_st *rsa;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  bp = BIO_new_mem_buf(x509privatekey,-1);
  if (bp == (BIO *)0x0) {
    log_ERR_get_error("cannot create private key BIO");
    return 0xb1;
  }
  pkey = PEM_read_bio_PrivateKey(bp,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
  if (pkey == (EVP_PKEY *)0x0) {
    log_ERR_get_error("failure creating private key evp_key");
    iVar1 = 0xba;
    goto LAB_0010ad5c;
  }
  iVar1 = EVP_PKEY_get_id(pkey);
  if ((iVar1 == 0x13) || (iVar1 == 6)) {
    rsa = EVP_PKEY_get1_RSA(pkey);
    if (rsa == (rsa_st *)0x0) {
      log_ERR_get_error("Failure reading RSA private key");
    }
    else {
      iVar1 = SSL_CTX_use_RSAPrivateKey((SSL_CTX *)ssl_ctx,rsa);
      if (iVar1 == 1) {
        RSA_free(rsa);
        goto LAB_0010acf5;
      }
      log_ERR_get_error("Failure calling SSL_CTX_use_RSAPrivateKey");
      RSA_free(rsa);
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xc5;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "failure loading RSA private key cert";
      iVar3 = 0xc4;
LAB_0010ad49:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/x509_openssl.c"
                ,"x509_openssl_add_pem_file_key",iVar3,1,pcVar4);
    }
  }
  else {
    iVar1 = load_ecc_key(ssl_ctx,(EVP_PKEY *)pkey);
    if (iVar1 == 0) {
LAB_0010acf5:
      iVar1 = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0xd1;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "failure loading ECC private key cert";
        iVar3 = 0xd0;
        goto LAB_0010ad49;
      }
    }
  }
  EVP_PKEY_free(pkey);
LAB_0010ad5c:
  BIO_free(bp);
  return iVar1;
}

Assistant:

int x509_openssl_add_pem_file_key(SSL_CTX* ssl_ctx, const char* x509privatekey)
{
    int result;

    BIO* bio_key = BIO_new_mem_buf((char*)x509privatekey, -1); /*taking off the const from the pointer is needed on older versions of OPENSSL*/
    if (bio_key == NULL)
    {
        log_ERR_get_error("cannot create private key BIO");
        result = MU_FAILURE;
    }
    else
    {
        // Get the Private Key type
        EVP_PKEY* evp_key = PEM_read_bio_PrivateKey(bio_key, NULL, NULL, NULL);
        if (evp_key == NULL)
        {
            log_ERR_get_error("failure creating private key evp_key");
            result = MU_FAILURE;
        }
        else
        {
            // Check the type for the EVP key
            int evp_type = EVP_PKEY_id(evp_key);
            if (evp_type == EVP_PKEY_RSA || evp_type == EVP_PKEY_RSA2)
            {
                if (load_key_RSA(ssl_ctx, evp_key) != 0)
                {
                    LogError("failure loading RSA private key cert");
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
            }
            else
            {
                if (load_ecc_key(ssl_ctx, evp_key) != 0)
                {
                    LogError("failure loading ECC private key cert");
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
            }
            EVP_PKEY_free(evp_key);
        }
        BIO_free(bio_key);
    }

    return result;
}